

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode.h
# Opt level: O1

byte_vec_t *
sfc::pack_native_tile
          (byte_vec_t *__return_storage_ptr__,index_vec_t *data,Mode mode,uint bpp,uint width,
          uint height)

{
  pointer puVar1;
  index_vec_t *piVar2;
  value_type *__val;
  undefined8 *puVar3;
  ulong uVar4;
  runtime_error *prVar5;
  byte bVar6;
  int iVar7;
  pointer puVar8;
  byte bVar9;
  byte bVar10;
  int iVar11;
  long lVar12;
  undefined4 in_register_0000008c;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar14;
  uint uVar13;
  uint x_2;
  byte bVar15;
  uint x_1;
  uint x_3;
  ulong uVar16;
  byte bVar17;
  uint x;
  sfc *this;
  long lVar18;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  undefined1 auVar19 [12];
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  byte_vec_t p;
  string local_b8;
  vector<unsigned_char,std::allocator<unsigned_char>> *local_98;
  anon_class_1_0_00000001 local_89;
  string local_88;
  ulong local_68;
  uint local_60;
  uint local_5c;
  pointer local_58;
  size_type sStack_50;
  ulong local_40;
  index_vec_t *local_38;
  
  aVar14._4_4_ = in_register_0000008c;
  aVar14._0_4_ = height;
  this = (sfc *)(ulong)mode;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98 = (vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__;
  if (mode < (gg|snes)) {
    if ((0x11aU >> (mode & (gg|sms)) & 1) != 0) {
      if ((width != 8) || (height != 8)) {
        auVar19 = __cxa_allocate_exception(0x10);
        mode_abi_cxx11_(&local_88,(sfc *)(ulong)mode,auVar19._8_4_);
        local_58 = local_88._M_dataplus._M_p;
        sStack_50 = local_88._M_string_length;
        fmt_00.size_ = 0xd;
        fmt_00.data_ = (char *)0x48;
        args_00.field_1.values_ = aVar14.values_;
        args_00.desc_ = (unsigned_long_long)&local_58;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_b8,
                   (v10 *)
                   "programmer error (tile size not 8x8 in pack_native_tile() for mode \"{}\")",
                   fmt_00,args_00);
        std::runtime_error::runtime_error(auVar19._0_8_,(string *)&local_b8);
        __cxa_throw(auVar19._0_8_,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (1 < bpp) {
        local_60 = bpp >> 1;
        local_68 = 0;
        uVar16 = 0;
        local_5c = bpp;
        local_38 = data;
        do {
          piVar2 = local_38;
          local_40 = uVar16;
          puVar3 = (undefined8 *)operator_new(0x10);
          *puVar3 = 0;
          puVar3[1] = 0;
          puVar8 = (piVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          if (puVar8 != (piVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish) {
            bVar15 = 1;
            uVar13 = (uint)local_40;
            uVar16 = local_68;
            while (uVar13 != 0) {
              bVar15 = bVar15 * '\x02';
              uVar13 = (int)uVar16 - 1;
              uVar16 = (ulong)uVar13;
            }
            bVar9 = (char)local_40 * '\x02';
            lVar12 = 0;
            do {
              bVar10 = *(byte *)((long)puVar3 + lVar12 * 2);
              bVar17 = *(byte *)((long)puVar3 + lVar12 * 2 + 1);
              bVar6 = 7;
              lVar18 = 0;
              do {
                bVar10 = bVar10 | ((puVar8[lVar18] & bVar15) >> (bVar9 & 0x1f)) << (bVar6 & 0x1f);
                *(byte *)((long)puVar3 + lVar12 * 2) = bVar10;
                bVar17 = bVar17 | ((puVar8[lVar18] & bVar15 * '\x02') >> (bVar9 & 0x1f | 1)) <<
                                  (bVar6 & 0x1f);
                *(byte *)((long)puVar3 + lVar12 * 2 + 1) = bVar17;
                lVar18 = lVar18 + 1;
                bVar6 = bVar6 - 1;
              } while (lVar18 != 8);
              lVar12 = lVar12 + 1;
              puVar8 = puVar8 + 8;
            } while (lVar12 != 8);
          }
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    (local_98,*(undefined8 *)(local_98 + 8),puVar3,puVar3 + 2);
          operator_delete(puVar3,0x10);
          uVar13 = (int)local_40 + 1;
          uVar16 = (ulong)uVar13;
          local_68 = (ulong)((int)local_68 + 2);
          data = local_38;
          bpp = local_5c;
        } while (uVar13 != local_60);
      }
      if (bpp != 1) {
        return (byte_vec_t *)local_98;
      }
      puVar8 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar1 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      uVar16 = (long)puVar1 - (long)puVar8;
      if ((uVar16 & 7) != 0) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar5,"programmer error (in_data not multiple of 8 in make_1bit_planes)");
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar16 = uVar16 >> 3;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b8,uVar16,
                 (allocator_type *)&local_88);
      if (puVar1 != puVar8) {
        uVar4 = 0;
        uVar13 = 0;
        do {
          bVar15 = 7;
          lVar12 = 0;
          bVar9 = 0;
          do {
            bVar9 = bVar9 | (byte)(1 << (bVar15 & 0x1f)) &
                            -((data->
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                              _M_impl.super__Vector_impl_data._M_start[lVar12 + (ulong)uVar13] & 1);
            lVar12 = lVar12 + 1;
            bVar15 = bVar15 - 1;
          } while (lVar12 != 8);
          local_b8._M_dataplus._M_p[uVar4] = bVar9;
          uVar13 = uVar13 + 8;
          uVar4 = (ulong)((int)uVar4 + 1);
        } while (uVar4 < uVar16);
      }
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (local_98,*(undefined8 *)(local_98 + 8),local_b8._M_dataplus._M_p,
                 local_b8._M_string_length);
      goto LAB_00157dfb;
    }
    if ((0x18c00U >> (mode & (gg|sms)) & 1) == 0) goto LAB_00157e24;
    if ((width != 8) || (height != 8)) {
      auVar19 = __cxa_allocate_exception(0x10);
      mode_abi_cxx11_(&local_88,this,auVar19._8_4_);
      local_58 = local_88._M_dataplus._M_p;
      sStack_50 = local_88._M_string_length;
      fmt.size_ = 0xd;
      fmt.data_ = (char *)0x48;
      args.field_1.values_ = aVar14.values_;
      args.desc_ = (unsigned_long_long)&local_58;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_b8,
                 (v10 *)"programmer error (tile size not 8x8 in pack_native_tile() for mode \"{}\")"
                 ,fmt,args);
      std::runtime_error::runtime_error(auVar19._0_8_,(string *)&local_b8);
      __cxa_throw(auVar19._0_8_,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (bpp == 2) {
      local_b8._M_dataplus._M_p = (pointer)0x0;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_allocated_capacity = 0;
      local_b8._M_dataplus._M_p = (pointer)operator_new(0x10);
      local_b8._M_string_length = (size_type)(local_b8._M_dataplus._M_p + 0x10);
      local_b8._M_dataplus._M_p[0] = '\0';
      local_b8._M_dataplus._M_p[1] = '\0';
      local_b8._M_dataplus._M_p[2] = '\0';
      local_b8._M_dataplus._M_p[3] = '\0';
      local_b8._M_dataplus._M_p[4] = '\0';
      local_b8._M_dataplus._M_p[5] = '\0';
      local_b8._M_dataplus._M_p[6] = '\0';
      local_b8._M_dataplus._M_p[7] = '\0';
      local_b8._M_dataplus._M_p[8] = '\0';
      local_b8._M_dataplus._M_p[9] = '\0';
      local_b8._M_dataplus._M_p[10] = '\0';
      local_b8._M_dataplus._M_p[0xb] = '\0';
      local_b8._M_dataplus._M_p[0xc] = '\0';
      local_b8._M_dataplus._M_p[0xd] = '\0';
      local_b8._M_dataplus._M_p[0xe] = '\0';
      local_b8._M_dataplus._M_p[0xf] = '\0';
      puVar8 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      local_b8.field_2._M_allocated_capacity = local_b8._M_string_length;
      if (puVar8 != (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish) {
        lVar12 = 0;
        do {
          bVar15 = local_b8._M_dataplus._M_p[lVar12 * 2];
          bVar9 = local_b8._M_dataplus._M_p[lVar12 * 2 + 1];
          bVar10 = 7;
          lVar18 = 0;
          do {
            bVar15 = bVar15 | (byte)((puVar8[lVar18] & 1) << (bVar10 & 0x1f));
            local_b8._M_dataplus._M_p[lVar12 * 2] = bVar15;
            bVar9 = bVar9 | (byte)((puVar8[lVar18] >> 1 & 1) << (bVar10 & 0x1f));
            local_b8._M_dataplus._M_p[lVar12 * 2 + 1] = bVar9;
            lVar18 = lVar18 + 1;
            bVar10 = bVar10 - 1;
          } while (lVar18 != 8);
          lVar12 = lVar12 + 1;
          puVar8 = puVar8 + 8;
        } while (lVar12 != 8);
      }
    }
    else {
      if (bpp != 4) {
        auVar19 = __cxa_allocate_exception(0x10);
        mode_abi_cxx11_(&local_88,this,auVar19._8_4_);
        local_58 = local_88._M_dataplus._M_p;
        sStack_50 = local_88._M_string_length;
        fmt_01.size_ = 0xd;
        fmt_01.data_ = (char *)0x30;
        args_01.field_1.values_ = aVar14.values_;
        args_01.desc_ = (unsigned_long_long)&local_58;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_b8,(v10 *)"programmer error (unsupported bpp for mode \"{}\")",fmt_01,
                   args_01);
        std::runtime_error::runtime_error(auVar19._0_8_,(string *)&local_b8);
        __cxa_throw(auVar19._0_8_,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_b8._M_dataplus._M_p = (pointer)0x0;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_allocated_capacity = 0;
      local_b8._M_dataplus._M_p = (pointer)operator_new(0x20);
      local_b8._M_string_length = (size_type)(local_b8._M_dataplus._M_p + 0x20);
      local_b8._M_dataplus._M_p[0x10] = '\0';
      local_b8._M_dataplus._M_p[0x11] = '\0';
      local_b8._M_dataplus._M_p[0x12] = '\0';
      local_b8._M_dataplus._M_p[0x13] = '\0';
      local_b8._M_dataplus._M_p[0x14] = '\0';
      local_b8._M_dataplus._M_p[0x15] = '\0';
      local_b8._M_dataplus._M_p[0x16] = '\0';
      local_b8._M_dataplus._M_p[0x17] = '\0';
      local_b8._M_dataplus._M_p[0x18] = '\0';
      local_b8._M_dataplus._M_p[0x19] = '\0';
      local_b8._M_dataplus._M_p[0x1a] = '\0';
      local_b8._M_dataplus._M_p[0x1b] = '\0';
      local_b8._M_dataplus._M_p[0x1c] = '\0';
      local_b8._M_dataplus._M_p[0x1d] = '\0';
      local_b8._M_dataplus._M_p[0x1e] = '\0';
      local_b8._M_dataplus._M_p[0x1f] = '\0';
      local_b8._M_dataplus._M_p[0] = '\0';
      local_b8._M_dataplus._M_p[1] = '\0';
      local_b8._M_dataplus._M_p[2] = '\0';
      local_b8._M_dataplus._M_p[3] = '\0';
      local_b8._M_dataplus._M_p[4] = '\0';
      local_b8._M_dataplus._M_p[5] = '\0';
      local_b8._M_dataplus._M_p[6] = '\0';
      local_b8._M_dataplus._M_p[7] = '\0';
      local_b8._M_dataplus._M_p[8] = '\0';
      local_b8._M_dataplus._M_p[9] = '\0';
      local_b8._M_dataplus._M_p[10] = '\0';
      local_b8._M_dataplus._M_p[0xb] = '\0';
      local_b8._M_dataplus._M_p[0xc] = '\0';
      local_b8._M_dataplus._M_p[0xd] = '\0';
      local_b8._M_dataplus._M_p[0xe] = '\0';
      local_b8._M_dataplus._M_p[0xf] = '\0';
      puVar8 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      local_b8.field_2._M_allocated_capacity = local_b8._M_string_length;
      if (puVar8 != (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish) {
        lVar12 = 0;
        do {
          bVar15 = local_b8._M_dataplus._M_p[lVar12 * 4];
          bVar9 = local_b8._M_dataplus._M_p[lVar12 * 4 + 1];
          bVar10 = local_b8._M_dataplus._M_p[lVar12 * 4 + 2];
          bVar17 = local_b8._M_dataplus._M_p[lVar12 * 4 + 3];
          bVar6 = 7;
          lVar18 = 0;
          do {
            bVar15 = bVar15 | (byte)((puVar8[lVar18] & 1) << (bVar6 & 0x1f));
            local_b8._M_dataplus._M_p[lVar12 * 4] = bVar15;
            bVar9 = bVar9 | (byte)((puVar8[lVar18] >> 1 & 1) << (bVar6 & 0x1f));
            local_b8._M_dataplus._M_p[lVar12 * 4 + 1] = bVar9;
            bVar10 = bVar10 | (byte)((puVar8[lVar18] >> 2 & 1) << (bVar6 & 0x1f));
            local_b8._M_dataplus._M_p[lVar12 * 4 + 2] = bVar10;
            bVar17 = bVar17 | (byte)((puVar8[lVar18] >> 3 & 1) << (bVar6 & 0x1f));
            local_b8._M_dataplus._M_p[lVar12 * 4 + 3] = bVar17;
            lVar18 = lVar18 + 1;
            bVar6 = bVar6 - 1;
          } while (lVar18 != 8);
          lVar12 = lVar12 + 1;
          puVar8 = puVar8 + 8;
        } while (lVar12 != 8);
      }
    }
  }
  else {
LAB_00157e24:
    if (mode - ngp < 2) {
      if ((width != 8) || (height != 8)) {
        auVar19 = __cxa_allocate_exception(0x10);
        mode_abi_cxx11_(&local_88,this,auVar19._8_4_);
        local_58 = local_88._M_dataplus._M_p;
        sStack_50 = local_88._M_string_length;
        fmt_02.size_ = 0xd;
        fmt_02.data_ = (char *)0x48;
        args_02.field_1.values_ = aVar14.values_;
        args_02.desc_ = (unsigned_long_long)&local_58;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_b8,
                   (v10 *)
                   "programmer error (tile size not 8x8 in pack_native_tile() for mode \"{}\")",
                   fmt_02,args_02);
        std::runtime_error::runtime_error(auVar19._0_8_,(string *)&local_b8);
        __cxa_throw(auVar19._0_8_,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (bpp != 2) {
        auVar19 = __cxa_allocate_exception(0x10);
        mode_abi_cxx11_(&local_88,this,auVar19._8_4_);
        local_58 = local_88._M_dataplus._M_p;
        sStack_50 = local_88._M_string_length;
        fmt_03.size_ = 0xd;
        fmt_03.data_ = (char *)0x30;
        args_03.field_1.values_ = aVar14.values_;
        args_03.desc_ = (unsigned_long_long)&local_58;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_b8,(v10 *)"programmer error (unsupported bpp for mode \"{}\")",fmt_03,
                   args_03);
        std::runtime_error::runtime_error(auVar19._0_8_,(string *)&local_b8);
        __cxa_throw(auVar19._0_8_,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_b8._M_dataplus._M_p = (pointer)0x0;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_allocated_capacity = 0;
      local_b8._M_dataplus._M_p = (pointer)operator_new(0x10);
      local_b8._M_string_length = (size_type)(local_b8._M_dataplus._M_p + 0x10);
      local_b8._M_dataplus._M_p[0] = '\0';
      local_b8._M_dataplus._M_p[1] = '\0';
      local_b8._M_dataplus._M_p[2] = '\0';
      local_b8._M_dataplus._M_p[3] = '\0';
      local_b8._M_dataplus._M_p[4] = '\0';
      local_b8._M_dataplus._M_p[5] = '\0';
      local_b8._M_dataplus._M_p[6] = '\0';
      local_b8._M_dataplus._M_p[7] = '\0';
      local_b8._M_dataplus._M_p[8] = '\0';
      local_b8._M_dataplus._M_p[9] = '\0';
      local_b8._M_dataplus._M_p[10] = '\0';
      local_b8._M_dataplus._M_p[0xb] = '\0';
      local_b8._M_dataplus._M_p[0xc] = '\0';
      local_b8._M_dataplus._M_p[0xd] = '\0';
      local_b8._M_dataplus._M_p[0xe] = '\0';
      local_b8._M_dataplus._M_p[0xf] = '\0';
      puVar8 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      local_b8.field_2._M_allocated_capacity = local_b8._M_string_length;
      if (puVar8 != (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish) {
        lVar12 = 0;
        do {
          bVar15 = 0xe;
          uVar13 = 7;
          lVar18 = 0;
          do {
            local_b8._M_dataplus._M_p[(ulong)(uVar13 >> 2) + lVar12 * 2] =
                 local_b8._M_dataplus._M_p[(ulong)(uVar13 >> 2) + lVar12 * 2] |
                 (byte)((puVar8[lVar18] & 3) << (bVar15 & 6));
            lVar18 = lVar18 + 1;
            bVar15 = bVar15 - 2;
            uVar13 = uVar13 - 1;
          } while (lVar18 != 8);
          lVar12 = lVar12 + 1;
          puVar8 = puVar8 + 8;
        } while (lVar12 != 8);
      }
    }
    else {
      if (mode == snes_mode7) {
LAB_00157fdf:
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (__return_storage_ptr__,data);
        return (byte_vec_t *)local_98;
      }
      if ((2 < mode - gba) && (mode != wsc_packed)) {
        if (mode != pce_sprite) {
          return __return_storage_ptr__;
        }
        iVar11 = 0;
        do {
          puVar8 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                   .super__Vector_impl_data._M_start;
          puVar1 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                   .super__Vector_impl_data._M_finish;
          uVar16 = (long)puVar1 - (long)puVar8;
          if ((uVar16 & 7) != 0) {
            prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error
                      (prVar5,"programmer error (in_data not multiple of 8 in make_1bit_planes)");
            __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          uVar16 = uVar16 >> 3;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b8,uVar16,
                     (allocator_type *)&local_88);
          bVar15 = 1;
          for (iVar7 = iVar11; iVar7 != 0; iVar7 = iVar7 + -1) {
            bVar15 = bVar15 * '\x02';
          }
          if (puVar1 != puVar8) {
            uVar4 = 0;
            uVar13 = 0;
            do {
              lVar12 = 0;
              bVar9 = 0;
              do {
                bVar10 = (byte)(1 << ((byte)lVar12 & 0x1f));
                if (((data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start[lVar12 + (ulong)uVar13] & bVar15) == 0
                   ) {
                  bVar10 = 0;
                }
                bVar9 = bVar9 | bVar10;
                lVar12 = lVar12 + 1;
              } while (lVar12 != 8);
              local_b8._M_dataplus._M_p[uVar4] = bVar9;
              uVar13 = uVar13 + 8;
              uVar4 = (ulong)((int)uVar4 + 1);
            } while (uVar4 < uVar16);
          }
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    (local_98,*(undefined8 *)(local_98 + 8),local_b8._M_dataplus._M_p);
          if (local_b8._M_dataplus._M_p != (pointer)0x0) {
            operator_delete(local_b8._M_dataplus._M_p,
                            local_b8.field_2._M_allocated_capacity - (long)local_b8._M_dataplus._M_p
                           );
          }
          iVar11 = iVar11 + 1;
        } while (iVar11 != 4);
        return (byte_vec_t *)local_98;
      }
      if (bpp != 4) {
        if (bpp != 8) {
          auVar19 = __cxa_allocate_exception(0x10);
          mode_abi_cxx11_(&local_88,this,auVar19._8_4_);
          local_58 = local_88._M_dataplus._M_p;
          sStack_50 = local_88._M_string_length;
          fmt_04.size_ = 0xd;
          fmt_04.data_ = (char *)0x30;
          args_04.field_1.args_ = aVar14.args_;
          args_04.desc_ = (unsigned_long_long)&local_58;
          ::fmt::v10::vformat_abi_cxx11_
                    (&local_b8,(v10 *)"programmer error (unsupported bpp for mode \"{}\")",fmt_04,
                     args_04);
          std::runtime_error::runtime_error(auVar19._0_8_,(string *)&local_b8);
          __cxa_throw(auVar19._0_8_,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                     );
        }
        goto LAB_00157fdf;
      }
      pack_native_tile::anon_class_1_0_00000001::operator()
                ((byte_vec_t *)&local_b8,&local_89,data,mode == wsc_packed);
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98,&local_b8);
LAB_00157dfb:
  if (local_b8._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_b8._M_dataplus._M_p,
                    local_b8.field_2._M_allocated_capacity - (long)local_b8._M_dataplus._M_p);
  }
  return (byte_vec_t *)local_98;
}

Assistant:

inline byte_vec_t pack_native_tile(const index_vec_t& data, Mode mode, unsigned bpp, unsigned width, unsigned height) {

  // wsc/sms/gg planar style bit planes
  auto make_4bit_planes = [](const index_vec_t& in_data, unsigned plane_index) {
    byte_vec_t p(32);
    if (in_data.empty())
      return p;

    index_t mask0 = 1;
    for (unsigned i = 0; i < plane_index; ++i)
      mask0 <<= 1;
    index_t mask1 = mask0 << 1;
    index_t mask2 = mask1 << 1;
    index_t mask3 = mask2 << 1;

    unsigned shift0 = plane_index;
    unsigned shift1 = plane_index + 1;
    unsigned shift2 = plane_index + 2;
    unsigned shift3 = plane_index + 3;

    for (unsigned y = 0; y < 8; ++y) {
      for (unsigned x = 0; x < 8; ++x) {
        p[y * 4 + 0] |= ((in_data[y * 8 + x] & mask0) >> shift0) << (7 - x);
        p[y * 4 + 1] |= ((in_data[y * 8 + x] & mask1) >> shift1) << (7 - x);
        p[y * 4 + 2] |= ((in_data[y * 8 + x] & mask2) >> shift2) << (7 - x);
        p[y * 4 + 3] |= ((in_data[y * 8 + x] & mask3) >> shift3) << (7 - x);
      }
    }
    return p;
  };

  // snes/gameboy style bit planes
  auto make_2bit_planes = [](const index_vec_t& in_data, unsigned plane_index) {
    byte_vec_t p(16);
    if (in_data.empty())
      return p;

    index_t mask0 = 1;
    for (unsigned i = 0; i < plane_index; ++i)
      mask0 <<= 1;
    index_t mask1 = mask0 << 1;

    unsigned shift0 = plane_index;
    unsigned shift1 = plane_index + 1;

    for (unsigned y = 0; y < 8; ++y) {
      for (unsigned x = 0; x < 8; ++x) {
        p[y * 2 + 0] |= ((in_data[y * 8 + x] & mask0) >> shift0) << (7 - x);
        p[y * 2 + 1] |= ((in_data[y * 8 + x] & mask1) >> shift1) << (7 - x);
      }
    }
    return p;
  };

  // regular bit planes
  auto make_1bit_planes = [](const index_vec_t& in_data, unsigned plane, bool reverse) {
    if (in_data.size() % 8)
      throw std::runtime_error("programmer error (in_data not multiple of 8 in make_1bit_planes)");

    size_t plane_size = in_data.size() >> 3;
    byte_vec_t p(plane_size);

    index_t mask = 1;
    for (unsigned i = 0; i < plane; ++i)
      mask <<= 1;

    for (unsigned index_b = 0, index_i = 0; index_b < plane_size; ++index_b) {
      index_t byte = 0;
      for (unsigned b = 0; b < 8; ++b) {
        if (in_data[index_i + b] & mask) {
          if (reverse)
            byte |= 1 << (7-b);
          else
            byte |= 1 << b;
        }
      }
      p[index_b] = byte;
      index_i += 8;
    }
    return p;
  };

  // gba/md style 2 pixels per byte data
  auto make_4bpp_bitpack = [](const index_vec_t& in_data, bool endian_swap) {
    if (in_data.size() % 2)
      throw std::runtime_error("programmer error (in_data not multiple of 2 in make_4bpp_bitpack)");

    byte_vec_t bv(in_data.size() >> 1);
    if (endian_swap) {
      for (unsigned i = 0; i < bv.size(); ++i)
        bv[i] = (0x0f & in_data[(i << 1) + 1]) | (0xf0 & (in_data[i << 1] << 4));

    } else {
      for (unsigned i = 0; i < bv.size(); ++i)
        bv[i] = (0x0f & in_data[i << 1]) | (0xf0 & (in_data[(i << 1) + 1] << 4));

    }
    return bv;
  };

  // vb/ngp style 4 pixels per byte data
  auto make_2bpp_bitpack = [](const index_vec_t& in_data, bool reverse) {
    byte_vec_t p(16);
    if (in_data.empty())
      return p;

    for (unsigned y = 0; y < 8; ++y) {
      for (unsigned x = 0; x < 8; ++x) {
        unsigned px = reverse ? 7 - x : x;
        p[(y << 1) | (px >> 2)] |= (in_data[y * 8 + x] & 0x03) << ((px << 1) & 6);
      }
    }
    return p;
  };

  byte_vec_t nd;

  if (mode == Mode::snes || mode == Mode::gb || mode == Mode::gbc || mode == Mode::pce) {
    if (width != 8 || height != 8)
      throw std::runtime_error(
        fmt::format("programmer error (tile size not 8x8 in pack_native_tile() for mode \"{}\")", sfc::mode(mode)));

    unsigned planes = bpp >> 1;
    for (unsigned i = 0; i < planes; ++i) {
      auto plane = make_2bit_planes(data, i * 2);
      nd.insert(nd.end(), plane.begin(), plane.end());
    }
    // 1bpp had 0 iterations
    if(bpp == 1) {
      auto plane = make_1bit_planes(data, 0, true);
      nd.insert(nd.end(), plane.begin(), plane.end());
    }

  } else if (mode == Mode::ws || mode == Mode::wsc || mode == Mode::gg || mode == Mode::sms) {
    if (width != 8 || height != 8)
      throw std::runtime_error(
        fmt::format("programmer error (tile size not 8x8 in pack_native_tile() for mode \"{}\")", sfc::mode(mode)));

    if (bpp == 4) {
      nd = make_4bit_planes(data, 0);
    } else if (bpp == 2) {
      nd = make_2bit_planes(data, 0);
    } else {
      throw std::runtime_error(
        fmt::format("programmer error (unsupported bpp for mode \"{}\")", sfc::mode(mode)));
    }

  } else if (mode == Mode::ngp || mode == Mode::ngpc) {
    if (width != 8 || height != 8)
      throw std::runtime_error(
        fmt::format("programmer error (tile size not 8x8 in pack_native_tile() for mode \"{}\")", sfc::mode(mode)));

    if (bpp == 2) {
      nd = make_2bpp_bitpack(data, true);
    } else {
      throw std::runtime_error(
        fmt::format("programmer error (unsupported bpp for mode \"{}\")", sfc::mode(mode)));
    }

  } else if (mode == Mode::snes_mode7) {
    nd = data;

  } else if (mode == Mode::gba || mode == Mode::gba_affine || mode == Mode::md || mode == Mode::wsc_packed) {
    if (bpp == 8) {
      nd = data;
    } else if (bpp == 4) {
      nd = make_4bpp_bitpack(data, mode == Mode::wsc_packed);
    } else {
      throw std::runtime_error(
        fmt::format("programmer error (unsupported bpp for mode \"{}\")", sfc::mode(mode)));
    }

  } else if (mode == Mode::pce_sprite) {
    for (unsigned p = 0; p < 4; ++p) {
      auto plane = make_1bit_planes(data, p, false);
      nd.insert(nd.end(), plane.begin(), plane.end());
    }
  }

  return nd;
}